

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O3

void Omega_h::correct_integral_errors(Mesh *mesh,AdaptOpts *opts)

{
  void **ppvVar1;
  int *piVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  uint uVar4;
  uint uVar5;
  pointer pcVar6;
  long lVar7;
  long lVar8;
  Real RVar9;
  VarCompareOpts opts_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  void *pvVar11;
  Alloc *this;
  bool bVar12;
  I32 IVar13;
  Int IVar14;
  Int IVar15;
  Int IVar16;
  TagBase *pTVar17;
  string *psVar18;
  const_iterator cVar19;
  long *plVar20;
  const_iterator cVar21;
  undefined8 *puVar22;
  Now b;
  Alloc *pAVar23;
  undefined8 uVar24;
  char *pcVar25;
  char *pcVar26;
  int iVar27;
  Comm *this_00;
  bool bVar28;
  bool bVar29;
  Read<signed_char> side_class_dims;
  Adj elems2sides;
  Read<double> errors;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> error_name;
  Reals old_integrals;
  Adj sides2elems;
  Reals sizes;
  Read<double> old_densities;
  Bytes sides_are_bdry;
  Graph diffusion_graph;
  Read<double> new_densities;
  Read<double> new_integrals;
  Reals elem_sizes;
  undefined1 local_318 [32];
  Alloc *local_2f8;
  Alloc *local_2f0;
  undefined1 local_2e8 [32];
  Alloc *local_2c8;
  element_type *local_2c0;
  undefined1 local_2b8 [32];
  Alloc *local_298;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_290;
  TransferOpts *local_288;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_280;
  element_type *local_278;
  undefined1 local_270 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_250;
  element_type *local_248;
  Read<signed_char> local_240;
  Bytes local_230;
  Verbosity local_21c;
  undefined1 local_218 [32];
  Alloc *local_1f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f0;
  undefined1 local_1e8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a0;
  Int local_194;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_190;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  Graph local_180;
  Read<double> local_160;
  undefined1 local_150 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_140;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_138;
  Read<double> local_130;
  Read<double> local_120;
  Read<double> local_110;
  Reals local_100;
  Read<double> local_f0;
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  string local_c0;
  Graph local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  Alloc *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  
  local_288 = &opts->xfer_opts;
  bVar12 = should_conserve_any(mesh,local_288);
  if (!bVar12) {
    return;
  }
  begin_code("correct_integral_errors",(char *)0x0);
  Mesh::set_parting(mesh,OMEGA_H_GHOSTED,false);
  uVar4 = mesh->dim_;
  if (uVar4 < 4) {
    local_21c = opts->verbosity;
    uVar5 = uVar4 - 1;
    bVar12 = Mesh::owners_have_all_upward(mesh,uVar5);
    if (bVar12) {
      local_2e8._16_8_ = &DAT_69645f7373616c63;
      local_2e8._24_2_ = 0x6d;
      local_2e8._8_8_ = (element_type *)0x9;
      IVar16 = (Int)mesh;
      local_2e8._0_8_ = (Comm *)(local_2e8 + 0x10);
      Mesh::get_array<signed_char>((Mesh *)local_318,IVar16,(string *)(ulong)uVar5);
      if ((Comm *)local_2e8._0_8_ != (Comm *)(local_2e8 + 0x10)) {
        operator_delete((void *)local_2e8._0_8_,(ulong)(local_2e8._16_8_ + 1));
      }
      local_1e8._16_8_ = local_318._0_8_;
      if ((local_318._0_8_ & 7) == 0 && (Comm *)local_318._0_8_ != (Comm *)0x0) {
        if (entering_parallel == '\x01') {
          local_1e8._16_8_ = *(long *)local_318._0_8_ * 8 + 1;
        }
        else {
          *(int *)(local_318._0_8_ + 0x30) = *(int *)(local_318._0_8_ + 0x30) + 1;
        }
      }
      local_1d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_318._8_8_;
      each_lt<signed_char>
                ((Omega_h *)&local_1c8,(Read<signed_char> *)(local_1e8 + 0x10),(char)uVar4);
      uVar24 = local_1e8._16_8_;
      if ((local_1e8._16_8_ & 7) == 0 && (Comm *)local_1e8._16_8_ != (Comm *)0x0) {
        p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1e8._16_8_ + 0x30);
        *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc((Alloc *)local_1e8._16_8_);
          operator_delete((void *)uVar24,0x48);
        }
      }
      Mesh::comm(mesh);
      IVar13 = Comm::size((Comm *)local_2e8._0_8_);
      if ((element_type *)local_2e8._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8._8_8_);
      }
      if (1 < IVar13) {
        local_230.write_.shared_alloc_.alloc = (Alloc *)local_1c8._M_pi;
        if (((ulong)local_1c8._M_pi & 7) == 0 && (Comm *)local_1c8._M_pi != (Comm *)0x0) {
          if (entering_parallel == '\x01') {
            local_230.write_.shared_alloc_.alloc =
                 (Alloc *)((long)(local_1c8._M_pi)->_vptr__Sp_counted_base * 8 + 1);
          }
          else {
            *(int *)&local_1c8._M_pi[3]._vptr__Sp_counted_base =
                 *(int *)&local_1c8._M_pi[3]._vptr__Sp_counted_base + 1;
          }
        }
        local_230.write_.shared_alloc_.direct_ptr = _Stack_1c0._M_pi;
        mark_exposed_sides((Omega_h *)local_1e8,mesh);
        lor_each((Omega_h *)local_2e8,&local_230,(Bytes *)local_1e8);
        if (((ulong)local_1c8._M_pi & 7) == 0 && (Comm *)local_1c8._M_pi != (Comm *)0x0) {
          p_Var3 = local_1c8._M_pi + 3;
          *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
          if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
            Alloc::~Alloc((Alloc *)local_1c8._M_pi);
            operator_delete(local_1c8._M_pi,0x48);
          }
        }
        local_1c8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8._0_8_;
        _Stack_1c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8._8_8_;
        if (((local_2e8._0_8_ & 7) == 0 && (Comm *)local_2e8._0_8_ != (Comm *)0x0) &&
           (entering_parallel == '\x01')) {
          *(int *)(local_2e8._0_8_ + 0x30) = *(int *)(local_2e8._0_8_ + 0x30) + -1;
          local_1c8._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(*(long *)local_2e8._0_8_ * 8 + 1);
        }
        uVar24 = local_1e8._0_8_;
        local_2e8._0_8_ = (Comm *)0x0;
        local_2e8._8_8_ = (element_type *)0x0;
        if ((local_1e8._0_8_ & 7) == 0 && (Alloc *)local_1e8._0_8_ != (Alloc *)0x0) {
          p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1e8._0_8_ + 0x30);
          *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
          if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
            Alloc::~Alloc((Alloc *)local_1e8._0_8_);
            operator_delete((void *)uVar24,0x48);
          }
        }
        pAVar23 = local_230.write_.shared_alloc_.alloc;
        if (((ulong)local_230.write_.shared_alloc_.alloc & 7) == 0 &&
            (Comm *)local_230.write_.shared_alloc_.alloc != (Comm *)0x0) {
          p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)local_230.write_.shared_alloc_.alloc + 0x30);
          *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
          if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
            Alloc::~Alloc(local_230.write_.shared_alloc_.alloc);
            operator_delete(pAVar23,0x48);
          }
        }
      }
      Mesh::ask_down((Adj *)local_2e8,mesh,uVar4,uVar5);
      Mesh::ask_up((Adj *)local_218,mesh,uVar5,uVar4);
      local_270._0_8_ = local_2e8._0_8_;
      if ((local_2e8._0_8_ & 7) == 0 && (Comm *)local_2e8._0_8_ != (Comm *)0x0) {
        if (entering_parallel == '\x01') {
          local_270._0_8_ = *(long *)local_2e8._0_8_ * 8 + 1;
        }
        else {
          *(int *)(local_2e8._0_8_ + 0x30) = *(int *)(local_2e8._0_8_ + 0x30) + 1;
        }
      }
      local_270._8_8_ = local_2e8._8_8_;
      local_270._16_8_ = local_2e8._16_8_;
      if ((local_2e8._16_8_ & 7) == 0 && (Alloc *)local_2e8._16_8_ != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_270._16_8_ = *(long *)local_2e8._16_8_ * 8 + 1;
        }
        else {
          *(int *)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)
                   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_2e8._16_8_ + 0x30))->
                    _vptr__Sp_counted_base)->_M_ptr =
               *(int *)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)
                        &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_2e8._16_8_ + 0x30))
                         ->_vptr__Sp_counted_base)->_M_ptr + 1;
        }
      }
      local_270._24_8_ = CONCAT62(local_2e8._26_6_,local_2e8._24_2_);
      local_250._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8;
      if (((ulong)local_2c8 & 7) == 0 && local_2c8 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_250._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)
                      &local_2c8->size)->_M_ptr * 8 + 1);
        }
        else {
          local_2c8->use_count = local_2c8->use_count + 1;
        }
      }
      local_248 = local_2c0;
      local_2b8._0_8_ = local_218._0_8_;
      if ((local_218._0_8_ & 7) == 0 && (Alloc *)local_218._0_8_ != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_2b8._0_8_ = *(long *)local_218._0_8_ * 8 + 1;
        }
        else {
          *(int *)(local_218._0_8_ + 0x30) = *(int *)(local_218._0_8_ + 0x30) + 1;
        }
      }
      local_2b8._8_8_ = local_218._8_8_;
      local_2b8._16_8_ = local_218._16_8_;
      if ((local_218._16_8_ & 7) == 0 && (Alloc *)local_218._16_8_ != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_2b8._16_8_ = *(long *)local_218._16_8_ * 8 + 1;
        }
        else {
          *(int *)(local_218._16_8_ + 0x30) = *(int *)(local_218._16_8_ + 0x30) + 1;
        }
      }
      local_2b8._24_8_ = local_218._24_8_;
      local_298 = local_1f8;
      if (((ulong)local_1f8 & 7) == 0 && local_1f8 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_298 = (Alloc *)((long)(((Graph *)&local_1f8->size)->a2ab).write_.shared_alloc_.alloc
                                * 8 + 1);
        }
        else {
          local_1f8->use_count = local_1f8->use_count + 1;
        }
      }
      local_290 = local_1f0._M_pi;
      local_240.write_.shared_alloc_.alloc = (Alloc *)local_1c8._M_pi;
      if (((ulong)local_1c8._M_pi & 7) == 0 && (Comm *)local_1c8._M_pi != (Comm *)0x0) {
        if (entering_parallel == '\x01') {
          local_240.write_.shared_alloc_.alloc =
               (Alloc *)((long)(local_1c8._M_pi)->_vptr__Sp_counted_base * 8 + 1);
        }
        else {
          *(int *)&local_1c8._M_pi[3]._vptr__Sp_counted_base =
               *(int *)&local_1c8._M_pi[3]._vptr__Sp_counted_base + 1;
        }
      }
      local_240.write_.shared_alloc_.direct_ptr = _Stack_1c0._M_pi;
      elements_across_sides(&local_180,uVar4,(Adj *)local_270,(Adj *)local_2b8,&local_240);
      pAVar23 = local_240.write_.shared_alloc_.alloc;
      if (((ulong)local_240.write_.shared_alloc_.alloc & 7) == 0 &&
          (Comm *)local_240.write_.shared_alloc_.alloc != (Comm *)0x0) {
        p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)local_240.write_.shared_alloc_.alloc + 0x30);
        *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc(pAVar23);
          operator_delete(pAVar23,0x48);
        }
      }
      Adj::~Adj((Adj *)local_2b8);
      Adj::~Adj((Adj *)local_270);
      Adj::~Adj((Adj *)local_218);
      Adj::~Adj((Adj *)local_2e8);
      _Var10._M_pi = local_1c8._M_pi;
      if (((ulong)local_1c8._M_pi & 7) == 0 && (Comm *)local_1c8._M_pi != (Comm *)0x0) {
        p_Var3 = local_1c8._M_pi + 3;
        *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc((Alloc *)_Var10._M_pi);
          operator_delete(_Var10._M_pi,0x48);
        }
      }
      uVar24 = local_318._0_8_;
      if ((local_318._0_8_ & 7) == 0 && (Comm *)local_318._0_8_ != (Comm *)0x0) {
        ppvVar1 = (void **)(local_318._0_8_ + 0x30);
        *(int *)ppvVar1 = *(int *)ppvVar1 + -1;
        if (*(int *)ppvVar1 == 0) {
          Alloc::~Alloc((Alloc *)local_318._0_8_);
          operator_delete((void *)uVar24,0x48);
        }
      }
      Mesh::ask_sizes((Mesh *)&local_60);
      uVar4 = mesh->dim_;
      if (3 < uVar4) {
        fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
             ,0x33);
      }
      local_c0.field_2._8_8_ = &(opts->xfer_opts).integral_map;
      local_c0.field_2._M_allocated_capacity = (size_type)&(opts->xfer_opts).integral_diffuse_map;
      local_188._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0;
      local_190._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0;
      local_1a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150;
      for (IVar15 = 0; IVar14 = Mesh::ntags(mesh,uVar4), IVar15 < IVar14; IVar15 = IVar15 + 1) {
        pTVar17 = Mesh::get_tag(mesh,uVar4,IVar15);
        bVar12 = should_conserve(mesh,local_288,uVar4,pTVar17);
        pvVar11 = local_180.ab2b.write_.shared_alloc_.direct_ptr;
        if (bVar12) {
          local_80._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_180.a2ab.write_.shared_alloc_.alloc;
          if (((ulong)local_180.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
              local_180.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_80._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((local_180.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_180.a2ab.write_.shared_alloc_.alloc)->use_count =
                   (local_180.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_78 = (Alloc *)local_180.a2ab.write_.shared_alloc_.direct_ptr;
          local_70._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_180.ab2b.write_.shared_alloc_.alloc;
          local_1a0._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_180.a2ab.write_.shared_alloc_.direct_ptr;
          if (((ulong)local_180.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
              local_180.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_70._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((local_180.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_180.ab2b.write_.shared_alloc_.alloc)->use_count =
                   (local_180.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_68._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_180.ab2b.write_.shared_alloc_.direct_ptr;
          uVar5 = mesh->dim_;
          local_2f8 = (Alloc *)local_70._M_pi;
          local_2f0 = (Alloc *)local_80._M_pi;
          local_194 = IVar15;
          if (3 < uVar5) {
            fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
                 ,0x33);
          }
          psVar18 = TagBase::name_abi_cxx11_(pTVar17);
          local_2e8._0_8_ = local_2e8 + 0x10;
          pcVar6 = (psVar18->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_2e8,pcVar6,pcVar6 + psVar18->_M_string_length);
          cVar19 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_c0.field_2._8_8_,(key_type *)local_2e8);
          local_218._0_8_ = local_218 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_218,*(long *)(cVar19._M_node + 2),
                     (long)&(cVar19._M_node[2]._M_parent)->_M_color + *(long *)(cVar19._M_node + 2))
          ;
          local_270._0_8_ = local_270 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_270,local_218._0_8_,
                     (pointer)(local_218._0_8_ +
                              (long)(__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                     *)local_218._8_8_));
          std::__cxx11::string::append((char *)local_270);
          IVar15 = TagBase::ncomps(pTVar17);
          Mesh::get_array<double>((Mesh *)(local_1e8 + 0x10),IVar16,(string *)(ulong)uVar5);
          local_318._0_8_ = local_318 + 0x10;
          local_318._16_4_ = 0x5f646c6f;
          local_318._8_8_ = (element_type *)0x4;
          local_318._20_4_ = local_318._20_4_ & 0xffffff00;
          plVar20 = (long *)std::__cxx11::string::_M_append(local_318,local_2e8._0_8_);
          local_2b8._0_8_ = local_2b8 + 0x10;
          pAVar23 = (Alloc *)(plVar20 + 2);
          if ((Alloc *)*plVar20 == pAVar23) {
            local_2b8._16_8_ =
                 ((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)&pAVar23->size
                 )->_M_ptr;
            local_2b8._24_8_ = plVar20[3];
          }
          else {
            local_2b8._16_8_ =
                 ((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)&pAVar23->size
                 )->_M_ptr;
            local_2b8._0_8_ = (Alloc *)*plVar20;
          }
          local_2b8._8_8_ = plVar20[1];
          *plVar20 = (long)pAVar23;
          plVar20[1] = 0;
          *(undefined1 *)(plVar20 + 2) = 0;
          local_230.write_.shared_alloc_.alloc = (Alloc *)local_1e8._16_8_;
          if ((local_1e8._16_8_ & 7) == 0 && (Comm *)local_1e8._16_8_ != (Comm *)0x0) {
            if (entering_parallel == '\x01') {
              local_230.write_.shared_alloc_.alloc =
                   (Alloc *)((long)*(Library **)local_1e8._16_8_ * 8 + 1);
            }
            else {
              *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1e8._16_8_ + 0x30))->
                       _vptr__Sp_counted_base =
                   *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            (local_1e8._16_8_ + 0x30))->_vptr__Sp_counted_base + 1;
            }
          }
          local_230.write_.shared_alloc_.direct_ptr = local_1d0._M_pi;
          Mesh::add_tag<double>
                    (mesh,uVar5,(string *)local_2b8,IVar15,(Read<double> *)&local_230,false);
          pAVar23 = local_230.write_.shared_alloc_.alloc;
          if (((ulong)local_230.write_.shared_alloc_.alloc & 7) == 0 &&
              (Comm *)local_230.write_.shared_alloc_.alloc != (Comm *)0x0) {
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)local_230.write_.shared_alloc_.alloc + 0x30);
            *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc(local_230.write_.shared_alloc_.alloc);
              operator_delete(pAVar23,0x48);
            }
          }
          if ((Alloc *)local_2b8._0_8_ != (Alloc *)(local_2b8 + 0x10)) {
            operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
          }
          if ((Alloc *)local_318._0_8_ != (Alloc *)(local_318 + 0x10)) {
            operator_delete((void *)local_318._0_8_,CONCAT44(local_318._20_4_,local_318._16_4_) + 1)
            ;
          }
          Mesh::ask_sizes((Mesh *)local_1e8);
          local_e0._0_8_ = local_1e8._16_8_;
          if ((local_1e8._16_8_ & 7) == 0 && (Comm *)local_1e8._16_8_ != (Comm *)0x0) {
            if (entering_parallel == '\x01') {
              local_e0._0_8_ = (long)*(Library **)local_1e8._16_8_ * 8 + 1;
            }
            else {
              *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1e8._16_8_ + 0x30))->
                       _vptr__Sp_counted_base =
                   *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            (local_1e8._16_8_ + 0x30))->_vptr__Sp_counted_base + 1;
            }
          }
          local_e0._8_8_ = local_1d0._M_pi;
          local_f0.write_.shared_alloc_.alloc = (Alloc *)local_1e8._0_8_;
          if ((local_1e8._0_8_ & 7) == 0 && (Alloc *)local_1e8._0_8_ != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_f0.write_.shared_alloc_.alloc =
                   (Alloc *)((long)*(_func_int ***)local_1e8._0_8_ * 8 + 1);
            }
            else {
              *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1e8._0_8_ + 0x30))->
                       _vptr__Sp_counted_base =
                   *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            (local_1e8._0_8_ + 0x30))->_vptr__Sp_counted_base + 1;
            }
          }
          local_f0.write_.shared_alloc_.direct_ptr = (void *)local_1e8._8_8_;
          local_2b8._0_8_ = local_2b8 + 0x10;
          local_2b8._8_8_ = (pointer)0x0;
          local_2b8._16_8_ = local_2b8._16_8_ & 0xffffffffffffff00;
          multiply_each<double>
                    ((Omega_h *)&local_40,(Read<double> *)local_e0,&local_f0,(string *)local_2b8);
          Read<double>::Read(&local_240,(Write<double> *)&local_40);
          _Var10._M_pi = local_40._M_pi;
          if (((ulong)local_40._M_pi & 7) == 0 && (Alloc *)local_40._M_pi != (Alloc *)0x0) {
            p_Var3 = local_40._M_pi + 3;
            *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc((Alloc *)local_40._M_pi);
              operator_delete(_Var10._M_pi,0x48);
            }
          }
          if ((Alloc *)local_2b8._0_8_ != (Alloc *)(local_2b8 + 0x10)) {
            operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
          }
          pAVar23 = local_f0.write_.shared_alloc_.alloc;
          if (((ulong)local_f0.write_.shared_alloc_.alloc & 7) == 0 &&
              local_f0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)local_f0.write_.shared_alloc_.alloc + 0x30);
            *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc(local_f0.write_.shared_alloc_.alloc);
              operator_delete(pAVar23,0x48);
            }
          }
          uVar24 = local_e0._0_8_;
          if ((local_e0._0_8_ & 7) == 0 && (Comm *)local_e0._0_8_ != (Comm *)0x0) {
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e0._0_8_ + 0x30);
            *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc((Alloc *)local_e0._0_8_);
              operator_delete((void *)uVar24,0x48);
            }
          }
          Mesh::get_array<double>((Mesh *)&local_280,IVar16,(string *)(ulong)uVar5);
          cVar21 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>_>_>
                           *)local_c0.field_2._M_allocated_capacity,(key_type *)local_218);
          local_1b8._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)cVar21._M_node[2]._M_left;
          local_1c8._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(cVar21._M_node + 2);
          _Stack_1c0._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)cVar21._M_node[2]._M_parent;
          local_2b8._0_8_ = local_2f0;
          bVar12 = local_2f0 != (Alloc *)0x0;
          bVar28 = ((ulong)local_2f0 & 7) == 0;
          if (bVar28 && bVar12) {
            if (entering_parallel == '\x01') {
              local_2b8._0_8_ = local_2f0->size * 8 + 1;
            }
            else {
              local_2f0->use_count = local_2f0->use_count + 1;
            }
          }
          local_2b8._8_8_ = local_1a0._M_pi;
          local_2b8._16_8_ = local_2f8;
          bVar29 = ((ulong)local_2f8 & 7) == 0;
          local_1a0._M_pi._0_1_ = bVar29 && local_2f8 != (Alloc *)0x0;
          if (bVar29 && local_2f8 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_2b8._16_8_ = local_2f8->size * 8 + 1;
            }
            else {
              local_2f8->use_count = local_2f8->use_count + 1;
            }
          }
          local_2b8._24_8_ = pvVar11;
          local_100.write_.shared_alloc_.alloc = (Alloc *)local_280._M_pi;
          if (((ulong)local_280._M_pi & 7) == 0 && (Alloc *)local_280._M_pi != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_100.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_280._M_pi)->_vptr__Sp_counted_base * 8 + 1);
            }
            else {
              *(int *)&local_280._M_pi[3]._vptr__Sp_counted_base =
                   *(int *)&local_280._M_pi[3]._vptr__Sp_counted_base + 1;
            }
          }
          this_00 = (Comm *)local_240.write_.shared_alloc_.alloc;
          local_100.write_.shared_alloc_.direct_ptr = local_278;
          local_c0._M_dataplus._M_p = (pointer)local_240.write_.shared_alloc_.alloc;
          if (((ulong)local_240.write_.shared_alloc_.alloc & 7) == 0 &&
              (Comm *)local_240.write_.shared_alloc_.alloc != (Comm *)0x0) {
            if (entering_parallel == '\x01') {
              this_00 = (Comm *)((long)(local_240.write_.shared_alloc_.alloc)->size * 8 + 1);
              local_c0._M_dataplus._M_p = (pointer)this_00;
            }
            else {
              *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       ((long)local_240.write_.shared_alloc_.alloc + 0x30))->_vptr__Sp_counted_base
                   = *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                              ((long)local_240.write_.shared_alloc_.alloc + 0x30))->
                              _vptr__Sp_counted_base + 1;
            }
          }
          local_c0._M_string_length = (size_type)local_240.write_.shared_alloc_.direct_ptr;
          opts_00.tolerance = (Real)_Stack_1c0._M_pi;
          opts_00._0_8_ = local_1c8._M_pi;
          opts_00.floor = (Real)local_1b8._M_pi;
          diffuse_integrals_weighted
                    ((Mesh *)local_318,(Graph *)mesh,(Reals *)local_2b8,&local_100,opts_00,&local_c0
                     ,SUB81(local_270,0));
          _Var10._M_pi = local_280._M_pi;
          if (((ulong)local_280._M_pi & 7) == 0 && (Alloc *)local_280._M_pi != (Alloc *)0x0) {
            p_Var3 = local_280._M_pi + 3;
            *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc((Alloc *)_Var10._M_pi);
              operator_delete(_Var10._M_pi,0x48);
            }
          }
          local_280._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_318._0_8_;
          local_278 = (element_type *)local_318._8_8_;
          if (((local_318._0_8_ & 7) == 0 && (Alloc *)local_318._0_8_ != (Alloc *)0x0) &&
             (entering_parallel == '\x01')) {
            *(int *)(local_318._0_8_ + 0x30) = *(int *)(local_318._0_8_ + 0x30) + -1;
            local_280._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(*(long *)local_318._0_8_ * 8 + 1);
          }
          local_318._0_8_ = (pointer)0x0;
          local_318._8_8_ = (element_type *)0x0;
          if (((ulong)this_00 & 7) == 0 && this_00 != (Comm *)0x0) {
            ppvVar1 = &(this_00->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
            *(int *)ppvVar1 = *(int *)ppvVar1 + -1;
            if (*(int *)ppvVar1 == 0) {
              Alloc::~Alloc((Alloc *)this_00);
              operator_delete(this_00,0x48);
            }
          }
          pAVar23 = local_100.write_.shared_alloc_.alloc;
          if (((ulong)local_100.write_.shared_alloc_.alloc & 7) == 0 &&
              local_100.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)local_100.write_.shared_alloc_.alloc + 0x30);
            *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc(pAVar23);
              operator_delete(pAVar23,0x48);
            }
          }
          uVar24 = local_2b8._16_8_;
          if ((local_2b8._16_8_ & 7) == 0 && (Alloc *)local_2b8._16_8_ != (Alloc *)0x0) {
            piVar2 = (int *)(local_2b8._16_8_ + 0x30);
            *piVar2 = *piVar2 + -1;
            if (*piVar2 == 0) {
              Alloc::~Alloc((Alloc *)local_2b8._16_8_);
              operator_delete((void *)uVar24,0x48);
            }
          }
          uVar24 = local_2b8._0_8_;
          if ((local_2b8._0_8_ & 7) == 0 && (Alloc *)local_2b8._0_8_ != (Alloc *)0x0) {
            piVar2 = (int *)(local_2b8._0_8_ + 0x30);
            *piVar2 = *piVar2 + -1;
            if (*piVar2 == 0) {
              Alloc::~Alloc((Alloc *)local_2b8._0_8_);
              operator_delete((void *)uVar24,0x48);
            }
          }
          local_110.write_.shared_alloc_.alloc = (Alloc *)local_280._M_pi;
          if (((ulong)local_280._M_pi & 7) == 0 && (Alloc *)local_280._M_pi != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_110.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_280._M_pi)->_vptr__Sp_counted_base * 8 + 1);
            }
            else {
              *(int *)&local_280._M_pi[3]._vptr__Sp_counted_base =
                   *(int *)&local_280._M_pi[3]._vptr__Sp_counted_base + 1;
            }
          }
          local_110.write_.shared_alloc_.direct_ptr = local_278;
          Mesh::set_tag<double>(mesh,uVar5,(string *)local_270,&local_110,false);
          pAVar23 = local_110.write_.shared_alloc_.alloc;
          if (((ulong)local_110.write_.shared_alloc_.alloc & 7) == 0 &&
              local_110.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)local_110.write_.shared_alloc_.alloc + 0x30);
            *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc(pAVar23);
              operator_delete(pAVar23,0x48);
            }
          }
          local_120.write_.shared_alloc_.alloc = local_240.write_.shared_alloc_.alloc;
          if (((ulong)local_240.write_.shared_alloc_.alloc & 7) == 0 &&
              (Comm *)local_240.write_.shared_alloc_.alloc != (Comm *)0x0) {
            if (entering_parallel == '\x01') {
              local_120.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_240.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       ((long)local_240.write_.shared_alloc_.alloc + 0x30))->_vptr__Sp_counted_base
                   = *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                              ((long)local_240.write_.shared_alloc_.alloc + 0x30))->
                              _vptr__Sp_counted_base + 1;
            }
          }
          local_120.write_.shared_alloc_.direct_ptr = local_240.write_.shared_alloc_.direct_ptr;
          local_130.write_.shared_alloc_.alloc = (Alloc *)local_280._M_pi;
          if (((ulong)local_280._M_pi & 7) == 0 && (Alloc *)local_280._M_pi != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_130.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_280._M_pi)->_vptr__Sp_counted_base * 8 + 1);
            }
            else {
              *(int *)&local_280._M_pi[3]._vptr__Sp_counted_base =
                   *(int *)&local_280._M_pi[3]._vptr__Sp_counted_base + 1;
            }
          }
          local_130.write_.shared_alloc_.direct_ptr = local_278;
          subtract_each<double>((Omega_h *)local_d0,&local_120,&local_130);
          pAVar23 = local_130.write_.shared_alloc_.alloc;
          if (((ulong)local_130.write_.shared_alloc_.alloc & 7) == 0 &&
              local_130.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)local_130.write_.shared_alloc_.alloc + 0x30);
            *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc(pAVar23);
              operator_delete(pAVar23,0x48);
            }
          }
          pAVar23 = local_120.write_.shared_alloc_.alloc;
          if (((ulong)local_120.write_.shared_alloc_.alloc & 7) == 0 &&
              (Comm *)local_120.write_.shared_alloc_.alloc != (Comm *)0x0) {
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)local_120.write_.shared_alloc_.alloc + 0x30);
            *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc(pAVar23);
              operator_delete(pAVar23,0x48);
            }
          }
          local_150._0_8_ = local_d0._0_8_;
          if ((local_d0._0_8_ & 7) == 0 && (Alloc *)local_d0._0_8_ != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_150._0_8_ = (long)*(_func_int ***)local_d0._0_8_ * 8 + 1;
            }
            else {
              *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d0._0_8_ + 0x30))->
                       _vptr__Sp_counted_base =
                   *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d0._0_8_ + 0x30)
                            )->_vptr__Sp_counted_base + 1;
            }
          }
          local_150._8_8_ = local_d0._8_8_;
          local_160.write_.shared_alloc_.alloc = (Alloc *)local_1e8._0_8_;
          if ((local_1e8._0_8_ & 7) == 0 && (Alloc *)local_1e8._0_8_ != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_160.write_.shared_alloc_.alloc =
                   (Alloc *)((long)*(_func_int ***)local_1e8._0_8_ * 8 + 1);
            }
            else {
              *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1e8._0_8_ + 0x30))->
                       _vptr__Sp_counted_base =
                   *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            (local_1e8._0_8_ + 0x30))->_vptr__Sp_counted_base + 1;
            }
          }
          local_160.write_.shared_alloc_.direct_ptr = (void *)local_1e8._8_8_;
          local_318._0_8_ = local_318 + 0x10;
          local_318._8_8_ = (element_type *)0x0;
          local_318._16_4_ = local_318._16_4_ & 0xffffff00;
          divide_each<double>((Omega_h *)&local_50,(Read<double> *)local_150,&local_160,
                              (string *)local_318);
          read<double>((Omega_h *)&local_140,(Write<signed_char> *)&local_50);
          _Var10._M_pi = local_50._M_pi;
          if (((ulong)local_50._M_pi & 7) == 0 && (Alloc *)local_50._M_pi != (Alloc *)0x0) {
            p_Var3 = local_50._M_pi + 3;
            *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc((Alloc *)local_50._M_pi);
              operator_delete(_Var10._M_pi,0x48);
            }
          }
          if ((undefined1 *)local_318._0_8_ != local_318 + 0x10) {
            operator_delete((void *)local_318._0_8_,CONCAT44(local_318._20_4_,local_318._16_4_) + 1)
            ;
          }
          pAVar23 = local_160.write_.shared_alloc_.alloc;
          if (((ulong)local_160.write_.shared_alloc_.alloc & 7) == 0 &&
              local_160.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar2 = &(local_160.write_.shared_alloc_.alloc)->use_count;
            *piVar2 = *piVar2 + -1;
            if (*piVar2 == 0) {
              Alloc::~Alloc(local_160.write_.shared_alloc_.alloc);
              operator_delete(pAVar23,0x48);
            }
          }
          uVar24 = local_150._0_8_;
          if ((local_150._0_8_ & 7) == 0 && (Alloc *)local_150._0_8_ != (Alloc *)0x0) {
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_150._0_8_ + 0x30);
            *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc((Alloc *)local_150._0_8_);
              operator_delete((void *)uVar24,0x48);
            }
          }
          local_318._0_8_ = local_140._M_pi;
          if (((ulong)local_140._M_pi & 7) == 0 && (Comm *)local_140._M_pi != (Comm *)0x0) {
            if (entering_parallel == '\x01') {
              local_318._0_8_ = (long)(local_140._M_pi)->_vptr__Sp_counted_base * 8 + 1;
            }
            else {
              *(int *)&local_140._M_pi[3]._vptr__Sp_counted_base =
                   *(int *)&local_140._M_pi[3]._vptr__Sp_counted_base + 1;
            }
          }
          local_318._8_8_ = local_138._M_pi;
          Mesh::set_tag<double>(mesh,uVar5,(string *)local_2e8,(Read<double> *)local_318,false);
          uVar24 = local_318._0_8_;
          if ((local_318._0_8_ & 7) == 0 && (Comm *)local_318._0_8_ != (Comm *)0x0) {
            ppvVar1 = (void **)(local_318._0_8_ + 0x30);
            *(int *)ppvVar1 = *(int *)ppvVar1 + -1;
            if (*(int *)ppvVar1 == 0) {
              Alloc::~Alloc((Alloc *)local_318._0_8_);
              operator_delete((void *)uVar24,0x48);
            }
          }
          Mesh::remove_tag(mesh,uVar5,(string *)local_270);
          _Var10._M_pi = local_140._M_pi;
          if (((ulong)local_140._M_pi & 7) == 0 && (Comm *)local_140._M_pi != (Comm *)0x0) {
            p_Var3 = local_140._M_pi + 3;
            *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc((Alloc *)local_140._M_pi);
              operator_delete(_Var10._M_pi,0x48);
            }
          }
          uVar24 = local_d0._0_8_;
          if ((local_d0._0_8_ & 7) == 0 && (Alloc *)local_d0._0_8_ != (Alloc *)0x0) {
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d0._0_8_ + 0x30);
            *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc((Alloc *)local_d0._0_8_);
              operator_delete((void *)uVar24,0x48);
            }
          }
          _Var10._M_pi = local_280._M_pi;
          if (((ulong)local_280._M_pi & 7) == 0 && (Alloc *)local_280._M_pi != (Alloc *)0x0) {
            p_Var3 = local_280._M_pi + 3;
            *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc((Alloc *)_Var10._M_pi);
              operator_delete(_Var10._M_pi,0x48);
            }
          }
          pAVar23 = local_240.write_.shared_alloc_.alloc;
          if (((ulong)local_240.write_.shared_alloc_.alloc & 7) == 0 &&
              (Comm *)local_240.write_.shared_alloc_.alloc != (Comm *)0x0) {
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)local_240.write_.shared_alloc_.alloc + 0x30);
            *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc(pAVar23);
              operator_delete(pAVar23,0x48);
            }
          }
          uVar24 = local_1e8._0_8_;
          if ((local_1e8._0_8_ & 7) == 0 && (Alloc *)local_1e8._0_8_ != (Alloc *)0x0) {
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1e8._0_8_ + 0x30);
            *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc((Alloc *)local_1e8._0_8_);
              operator_delete((void *)uVar24,0x48);
            }
          }
          uVar24 = local_1e8._16_8_;
          if ((local_1e8._16_8_ & 7) == 0 && (Comm *)local_1e8._16_8_ != (Comm *)0x0) {
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1e8._16_8_ + 0x30);
            *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc((Alloc *)local_1e8._16_8_);
              operator_delete((void *)uVar24,0x48);
            }
          }
          if ((Comm *)local_270._0_8_ != (Comm *)(local_270 + 0x10)) {
            operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
          }
          IVar15 = local_194;
          if ((Alloc *)local_218._0_8_ != (Alloc *)(local_218 + 0x10)) {
            operator_delete((void *)local_218._0_8_,(ulong)(local_218._16_8_ + 1));
          }
          if ((Comm *)local_2e8._0_8_ != (Comm *)(local_2e8 + 0x10)) {
            operator_delete((void *)local_2e8._0_8_,(ulong)(local_2e8._16_8_ + 1));
          }
          pAVar23 = local_2f8;
          if ((char)local_1a0._M_pi != '\0') {
            piVar2 = &local_2f8->use_count;
            *piVar2 = *piVar2 + -1;
            if (*piVar2 == 0) {
              Alloc::~Alloc(local_2f8);
              operator_delete(pAVar23,0x48);
            }
          }
          pAVar23 = local_2f0;
          if (bVar28 && bVar12) {
            piVar2 = &local_2f0->use_count;
            *piVar2 = *piVar2 + -1;
            if (*piVar2 == 0) {
              Alloc::~Alloc(local_2f0);
              operator_delete(pAVar23,0x48);
            }
          }
        }
      }
      for (iVar27 = 0; IVar16 = Mesh::ntags(mesh,0), iVar27 < IVar16; iVar27 = iVar27 + 1) {
        pTVar17 = Mesh::get_tag(mesh,0,iVar27);
        bVar12 = is_momentum_velocity(mesh,local_288,0,pTVar17);
        if (bVar12) {
          local_a0.a2ab.write_.shared_alloc_.alloc = local_180.a2ab.write_.shared_alloc_.alloc;
          if (((ulong)local_180.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
              local_180.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_a0.a2ab.write_.shared_alloc_.alloc =
                   (Alloc *)((local_180.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_180.a2ab.write_.shared_alloc_.alloc)->use_count =
                   (local_180.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          pAVar23 = local_a0.a2ab.write_.shared_alloc_.alloc;
          local_a0.a2ab.write_.shared_alloc_.direct_ptr =
               local_180.a2ab.write_.shared_alloc_.direct_ptr;
          local_a0.ab2b.write_.shared_alloc_.alloc = local_180.ab2b.write_.shared_alloc_.alloc;
          if (((ulong)local_180.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
              local_180.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_a0.ab2b.write_.shared_alloc_.alloc =
                   (Alloc *)((local_180.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_180.ab2b.write_.shared_alloc_.alloc)->use_count =
                   (local_180.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          this = local_a0.ab2b.write_.shared_alloc_.alloc;
          local_a0.ab2b.write_.shared_alloc_.direct_ptr =
               local_180.ab2b.write_.shared_alloc_.direct_ptr;
          correct_momentum_error(mesh,local_288,&local_a0,pTVar17,0 < (int)local_21c);
          if (((ulong)this & 7) == 0 && this != (Alloc *)0x0) {
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)this + 0x30);
            *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc(this);
              operator_delete(this,0x48);
            }
          }
          if (((ulong)pAVar23 & 7) == 0 && pAVar23 != (Alloc *)0x0) {
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)pAVar23 + 0x30);
            *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc(pAVar23);
              operator_delete(pAVar23,0x48);
            }
          }
        }
      }
      for (iVar27 = 0; IVar16 = Mesh::ntags(mesh,uVar4), plVar20 = profile::global_singleton_history
          , iVar27 < IVar16; iVar27 = iVar27 + 1) {
        pTVar17 = Mesh::get_tag(mesh,uVar4,iVar27);
        bVar12 = should_conserve(mesh,local_288,uVar4,pTVar17);
        if (bVar12) {
          psVar18 = TagBase::name_abi_cxx11_(pTVar17);
          local_2e8._0_8_ = local_2e8 + 0x10;
          pcVar6 = (psVar18->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_2e8,pcVar6,pcVar6 + psVar18->_M_string_length);
          local_270._0_8_ = local_270 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"old_","");
          puVar22 = (undefined8 *)std::__cxx11::string::_M_append((char *)local_270,local_2e8._0_8_)
          ;
          local_218._0_8_ = local_218 + 0x10;
          pAVar23 = (Alloc *)(puVar22 + 2);
          if ((Alloc *)*puVar22 == pAVar23) {
            local_218._16_8_ = pAVar23->size;
            local_218._24_8_ = puVar22[3];
          }
          else {
            local_218._16_8_ = pAVar23->size;
            local_218._0_8_ = (Alloc *)*puVar22;
          }
          local_218._8_8_ = puVar22[1];
          *puVar22 = pAVar23;
          puVar22[1] = 0;
          *(undefined1 *)(puVar22 + 2) = 0;
          Mesh::remove_tag(mesh,uVar4,(string *)local_218);
          if ((Alloc *)local_218._0_8_ != (Alloc *)(local_218 + 0x10)) {
            operator_delete((void *)local_218._0_8_,(ulong)(local_218._16_8_ + 1));
          }
          if ((Comm *)local_270._0_8_ != (Comm *)(local_270 + 0x10)) {
            operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
          }
          if ((Comm *)local_2e8._0_8_ != (Comm *)(local_2e8 + 0x10)) {
            operator_delete((void *)local_2e8._0_8_,(ulong)(local_2e8._16_8_ + 1));
          }
        }
      }
      if (profile::global_singleton_history != (long *)0x0) {
        local_288 = *(TransferOpts **)
                     (*profile::global_singleton_history + 0x30 +
                     profile::global_singleton_history[3] * 0x40);
        b = now();
        RVar9 = operator-(b,(Impl)((Impl *)(*plVar20 + 0x28 + plVar20[3] * 0x40))->__d);
        lVar7 = *plVar20;
        lVar8 = plVar20[3];
        *(double *)(lVar7 + 0x30 + lVar8 * 0x40) = (double)local_288 + RVar9;
        plVar20[3] = *(long *)(lVar7 + lVar8 * 0x40);
      }
      if (((ulong)local_60._M_pi & 7) == 0 && (Alloc *)local_60._M_pi != (Alloc *)0x0) {
        p_Var3 = local_60._M_pi + 3;
        *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc((Alloc *)local_60._M_pi);
          operator_delete(local_60._M_pi,0x48);
        }
      }
      if (((ulong)local_180.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
          local_180.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar2 = &(local_180.ab2b.write_.shared_alloc_.alloc)->use_count;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          Alloc::~Alloc(local_180.ab2b.write_.shared_alloc_.alloc);
          operator_delete(local_180.ab2b.write_.shared_alloc_.alloc,0x48);
        }
      }
      if (((ulong)local_180.a2ab.write_.shared_alloc_.alloc & 7) != 0 ||
          local_180.a2ab.write_.shared_alloc_.alloc == (Alloc *)0x0) {
        return;
      }
      piVar2 = &(local_180.a2ab.write_.shared_alloc_.alloc)->use_count;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 != 0) {
        return;
      }
      Alloc::~Alloc(local_180.a2ab.write_.shared_alloc_.alloc);
      operator_delete(local_180.a2ab.write_.shared_alloc_.alloc,0x48);
      return;
    }
    pcVar26 = "mesh->owners_have_all_upward(dim - 1)";
    pcVar25 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_conserve.cpp"
    ;
    uVar24 = 0x26c;
  }
  else {
    pcVar26 = "0 <= dim_ && dim_ <= 3";
    pcVar25 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
    ;
    uVar24 = 0x33;
  }
  fail("assertion %s failed at %s +%d\n",pcVar26,pcVar25,uVar24);
}

Assistant:

void correct_integral_errors(Mesh* mesh, AdaptOpts const& opts) {
  auto& xfer_opts = opts.xfer_opts;
  if (!should_conserve_any(mesh, xfer_opts)) return;
  begin_code("correct_integral_errors");
  mesh->set_parting(OMEGA_H_GHOSTED);
  auto verbose = opts.verbosity > SILENT;
  auto diffusion_graph = get_elem_diffusion_graph(mesh);
  auto elem_sizes = mesh->ask_sizes();
  auto dim = mesh->dim();
  for (Int tagi = 0; tagi < mesh->ntags(dim); ++tagi) {
    auto tagbase = mesh->get_tag(dim, tagi);
    if (should_conserve(mesh, xfer_opts, dim, tagbase)) {
      correct_density_error(mesh, xfer_opts, diffusion_graph, tagbase, verbose);
    }
  }
  for (Int tagi = 0; tagi < mesh->ntags(VERT); ++tagi) {
    auto tagbase = mesh->get_tag(VERT, tagi);
    if (is_momentum_velocity(mesh, xfer_opts, VERT, tagbase)) {
      correct_momentum_error(
          mesh, xfer_opts, diffusion_graph, tagbase, verbose);
    }
  }
  for (Int tagi = 0; tagi < mesh->ntags(dim); ++tagi) {
    auto tagbase = mesh->get_tag(dim, tagi);
    if (should_conserve(mesh, xfer_opts, dim, tagbase)) {
      auto density_name = tagbase->name();
      mesh->remove_tag(dim, std::string("old_") + density_name);
    }
  }
  end_code();
}